

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall
mp::internal::FormatRST(internal *this,Writer *w,CStringRef s,int indent,ValueArrayRef values)

{
  undefined4 in_register_0000000c;
  Parser parser;
  RSTFormatter formatter;
  Parser local_b8;
  ContentHandler local_a8;
  internal *local_a0;
  undefined8 local_98;
  undefined4 local_90;
  _Deque_base<int,_std::allocator<int>_> local_88;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 local_30;
  
  local_a8._vptr_ContentHandler = (_func_int **)&PTR__RSTFormatter_002951b0;
  local_98 = CONCAT44(in_register_0000000c,indent);
  local_90 = values.values_._0_4_;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_a0 = this;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  local_b8.handler_ = &local_a8;
  local_34 = 0;
  local_30 = 0;
  local_b8.ptr_ = (char *)0x0;
  local_38 = (int)s.data_;
  rst::Parser::Parse(&local_b8,(char *)w);
  local_a8._vptr_ContentHandler = (_func_int **)&PTR__RSTFormatter_002951b0;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  rst::ContentHandler::~ContentHandler(&local_a8);
  return;
}

Assistant:

void FormatRST(fmt::Writer &w,
    fmt::CStringRef s, int indent, ValueArrayRef values) {
  RSTFormatter formatter(w, values, indent);
  rst::Parser parser(&formatter);
  parser.Parse(s.c_str());
}